

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CoreBroker.cpp
# Opt level: O0

void __thiscall
helics::CoreBroker::sendFedErrorAck(CoreBroker *this,ActionMessage *command,int32_t errorCode)

{
  route_id rVar1;
  undefined4 in_EDX;
  size_type in_RSI;
  long *in_RDI;
  string_view sVar2;
  ActionMessage badInit;
  undefined4 in_stack_fffffffffffffed8;
  undefined4 in_stack_fffffffffffffedc;
  CoreBroker *this_00;
  undefined4 in_stack_ffffffffffffff00;
  undefined4 in_stack_ffffffffffffff04;
  GlobalFederateId local_e0 [4];
  undefined4 local_cc;
  BaseType local_c8;
  undefined4 local_14;
  undefined8 local_10;
  
  this_00 = (CoreBroker *)&stack0xffffffffffffff30;
  local_14 = in_EDX;
  local_10 = in_RSI;
  ActionMessage::ActionMessage
            ((ActionMessage *)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),
             (action_t)((ulong)this_00 >> 0x20));
  setActionFlag<helics::ActionMessage,helics::GeneralFlags>((ActionMessage *)this_00,error_flag);
  GlobalFederateId::GlobalFederateId(local_e0,(GlobalBrokerId)*(BaseType *)((long)in_RDI + 0x14));
  local_c8 = local_e0[0].gid;
  local_cc = local_14;
  sVar2 = ActionMessage::name((ActionMessage *)0x5daaba);
  sVar2._M_str = (ActionMessage *)sVar2._M_str;
  sVar2._M_len._4_4_ = in_stack_fffffffffffffedc;
  sVar2._M_len._0_4_ = in_stack_fffffffffffffed8;
  sVar2._M_str = (char *)sVar2._M_str;
  ActionMessage::name((ActionMessage *)0x5daaee,sVar2);
  rVar1 = getRoute(this_00,(GlobalFederateId)*(BaseType *)(local_10 + 8));
  (**(code **)(*in_RDI + 0x110))(in_RDI,rVar1.rid,&stack0xffffffffffffff30);
  ActionMessage::~ActionMessage(sVar2._M_str);
  return;
}

Assistant:

void CoreBroker::sendFedErrorAck(ActionMessage& command, std::int32_t errorCode)
{
    ActionMessage badInit(CMD_FED_ACK);
    setActionFlag(badInit, error_flag);
    badInit.source_id = global_broker_id_local;
    badInit.messageID = errorCode;
    badInit.name(command.name());
    transmit(getRoute(command.source_id), badInit);
}